

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bytearray.c
# Opt level: O0

adt_error_t adt_bytearray_push(adt_bytearray_t *self,uint8_t value)

{
  uint8_t *pEnd;
  uint8_t *pNext;
  adt_error_t errorCode;
  uint8_t value_local;
  adt_bytearray_t *self_local;
  
  if (self == (adt_bytearray_t *)0x0) {
    self_local._7_1_ = '\x01';
  }
  else {
    self_local._7_1_ = adt_bytearray_reserve(self,self->u32CurLen + 1);
    if (self_local._7_1_ == '\0') {
      if (self->pData + self->u32AllocLen < self->pData + self->u32CurLen + 1) {
        __assert_fail("pNext + 1 <= pEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_bytearray.c"
                      ,0x112,"adt_error_t adt_bytearray_push(adt_bytearray_t *, uint8_t)");
      }
      self->pData[self->u32CurLen] = value;
      self->u32CurLen = self->u32CurLen + 1;
    }
  }
  return self_local._7_1_;
}

Assistant:

adt_error_t adt_bytearray_push(adt_bytearray_t *self, uint8_t value)
{
   if(self != 0)
   {
      adt_error_t errorCode = adt_bytearray_reserve(self, self->u32CurLen + 1);
      if(errorCode == ADT_NO_ERROR)
      {
         uint8_t *pNext, *pEnd;
         pNext = self->pData + self->u32CurLen;
         pEnd = self->pData + self->u32AllocLen;
         assert(pNext + 1 <= pEnd);
         *pNext = value;
         self->u32CurLen++;
      }
      return errorCode;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}